

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

int maxn(lua_State *L)

{
  int iVar1;
  lua_Number lVar2;
  lua_Number v;
  lua_Number max;
  lua_State *L_local;
  
  v = 0.0;
  luaL_checktype(L,1,5);
  lua_pushnil(L);
  while (iVar1 = lua_next(L,1), iVar1 != 0) {
    lua_settop(L,-2);
    iVar1 = lua_type(L,-1);
    if ((iVar1 == 3) && (lVar2 = lua_tonumberx(L,-1,(int *)0x0), v < lVar2)) {
      v = lVar2;
    }
  }
  lua_pushnumber(L,v);
  return 1;
}

Assistant:

static int maxn (lua_State *L) {
  lua_Number max = 0;
  luaL_checktype(L, 1, LUA_TTABLE);
  lua_pushnil(L);  /* first key */
  while (lua_next(L, 1)) {
    lua_pop(L, 1);  /* remove value */
    if (lua_type(L, -1) == LUA_TNUMBER) {
      lua_Number v = lua_tonumber(L, -1);
      if (v > max) max = v;
    }
  }
  lua_pushnumber(L, max);
  return 1;
}